

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_vertical_8_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  byte bVar69;
  byte bVar70;
  byte bVar71;
  undefined1 auVar72 [14];
  undefined1 auVar73 [12];
  unkbyte10 Var74;
  undefined1 auVar75 [14];
  undefined1 auVar76 [12];
  unkbyte10 Var77;
  undefined1 auVar78 [12];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [11];
  undefined1 auVar82 [15];
  unkuint9 Var83;
  undefined1 auVar84 [11];
  unkuint9 Var85;
  undefined1 auVar86 [11];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  unkuint9 Var91;
  undefined1 auVar92 [11];
  undefined1 auVar93 [15];
  unkuint9 Var94;
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  unkuint9 Var97;
  undefined1 auVar98 [11];
  undefined1 auVar99 [14];
  undefined1 auVar100 [12];
  unkuint10 Var101;
  undefined1 auVar102 [14];
  undefined1 auVar103 [12];
  undefined1 auVar104 [15];
  undefined1 auVar105 [11];
  undefined1 auVar106 [12];
  undefined1 auVar107 [15];
  undefined1 auVar108 [11];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  unkbyte9 Var132;
  undefined1 auVar133 [11];
  long lVar134;
  undefined1 uVar135;
  undefined1 uVar136;
  byte bVar137;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  undefined2 uVar143;
  undefined2 uVar144;
  undefined1 uVar158;
  undefined1 uVar159;
  undefined1 uVar162;
  undefined1 uVar163;
  undefined1 uVar171;
  undefined1 uVar172;
  undefined4 uVar145;
  undefined8 uVar147;
  undefined1 uVar175;
  undefined1 uVar176;
  short sVar178;
  undefined1 uVar183;
  undefined1 uVar184;
  undefined1 uVar186;
  undefined1 uVar187;
  undefined1 uVar194;
  undefined1 uVar195;
  undefined1 auVar148 [16];
  byte bVar160;
  byte bVar164;
  byte bVar173;
  byte bVar177;
  byte bVar185;
  byte bVar188;
  byte bVar196;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  short sVar166;
  short sVar167;
  short sVar168;
  short sVar169;
  short sVar170;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  short sVar193;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  byte bVar197;
  ushort uVar198;
  undefined1 uVar212;
  undefined1 uVar213;
  undefined1 uVar215;
  undefined4 uVar199;
  short sVar214;
  undefined1 uVar217;
  short sVar216;
  undefined1 uVar218;
  undefined1 uVar220;
  short sVar219;
  ushort uVar221;
  undefined1 auVar201 [13];
  undefined1 uVar222;
  undefined2 uVar353;
  undefined1 uVar235;
  undefined1 uVar236;
  undefined1 uVar237;
  undefined1 uVar238;
  undefined1 uVar239;
  undefined1 uVar240;
  undefined1 uVar242;
  short sVar241;
  ushort uVar243;
  ushort uVar244;
  undefined1 auVar223 [13];
  undefined1 auVar232 [16];
  undefined4 uVar245;
  short sVar247;
  undefined1 auVar246 [13];
  undefined1 auVar248 [13];
  undefined1 auVar249 [16];
  short sVar250;
  short sVar251;
  short sVar252;
  short sVar253;
  short sVar254;
  short sVar255;
  short sVar256;
  short sVar260;
  short sVar261;
  short sVar262;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  byte bVar263;
  byte bVar264;
  byte bVar270;
  byte bVar271;
  byte bVar272;
  byte bVar273;
  byte bVar274;
  byte bVar275;
  byte bVar276;
  byte bVar277;
  byte bVar278;
  byte bVar279;
  byte bVar280;
  byte bVar282;
  byte bVar283;
  byte bVar284;
  byte bVar285;
  byte bVar286;
  byte bVar287;
  byte bVar288;
  byte bVar289;
  undefined1 auVar265 [16];
  undefined1 auVar269 [16];
  byte bVar290;
  byte bVar291;
  uint uVar292;
  char cVar295;
  char cVar296;
  char cVar298;
  char cVar299;
  char cVar300;
  char cVar301;
  undefined1 auVar293 [16];
  char cVar297;
  undefined1 auVar294 [16];
  short sVar306;
  short sVar307;
  undefined4 uVar308;
  short sVar309;
  undefined1 auVar302 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  byte bVar314;
  byte bVar315;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  ushort uVar316;
  ushort uVar319;
  ushort uVar320;
  ushort uVar321;
  ushort uVar322;
  ushort uVar323;
  ushort uVar324;
  undefined1 auVar317 [16];
  ushort uVar325;
  undefined1 auVar318 [16];
  undefined1 auVar326 [16];
  byte bVar328;
  ulong uVar329;
  undefined1 auVar330 [13];
  byte bVar344;
  byte bVar345;
  byte bVar346;
  byte bVar347;
  byte bVar348;
  byte bVar349;
  byte bVar350;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar341 [16];
  undefined1 auVar343 [16];
  undefined1 auVar351 [16];
  byte bVar138;
  undefined6 uVar146;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  byte bVar161;
  byte bVar165;
  byte bVar174;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar200 [12];
  undefined1 auVar202 [14];
  undefined1 auVar211 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar233 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar234 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar224 [16];
  short sVar257;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  ulong uVar281;
  undefined1 auVar303 [16];
  undefined1 auVar310 [16];
  undefined1 auVar327 [16];
  undefined1 auVar334 [16];
  undefined1 auVar342 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar352 [16];
  
  uVar1 = *(ulong *)(s + -4);
  lVar134 = (long)p;
  uVar147 = *(undefined8 *)(s + lVar134 + -4);
  uVar194 = (undefined1)((ulong)uVar147 >> 0x38);
  uVar220 = (undefined1)(uVar1 >> 0x38);
  auVar210._8_6_ = 0;
  auVar210._0_8_ = uVar1;
  auVar210[0xe] = uVar220;
  auVar210[0xf] = uVar194;
  uVar186 = (undefined1)((ulong)uVar147 >> 0x30);
  auVar209._14_2_ = auVar210._14_2_;
  auVar209._8_5_ = 0;
  auVar209._0_8_ = uVar1;
  auVar209[0xd] = uVar186;
  uVar218 = (undefined1)(uVar1 >> 0x30);
  auVar208._13_3_ = auVar209._13_3_;
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar1;
  auVar208[0xc] = uVar218;
  uVar183 = (undefined1)((ulong)uVar147 >> 0x28);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_3_ = 0;
  auVar207._0_8_ = uVar1;
  auVar207[0xb] = uVar183;
  uVar217 = (undefined1)(uVar1 >> 0x28);
  auVar206._11_5_ = auVar207._11_5_;
  auVar206._8_2_ = 0;
  auVar206._0_8_ = uVar1;
  auVar206[10] = uVar217;
  uVar175 = (undefined1)((ulong)uVar147 >> 0x20);
  auVar205._10_6_ = auVar206._10_6_;
  auVar205[8] = 0;
  auVar205._0_8_ = uVar1;
  auVar205[9] = uVar175;
  auVar204._9_7_ = auVar205._9_7_;
  auVar204[8] = (char)(uVar1 >> 0x20);
  auVar204._0_8_ = uVar1;
  uVar171 = (undefined1)((ulong)uVar147 >> 0x18);
  uVar215 = (undefined1)(uVar1 >> 0x18);
  Var74 = CONCAT91(CONCAT81(auVar204._8_8_,uVar171),uVar215);
  uVar162 = (undefined1)((ulong)uVar147 >> 0x10);
  auVar73._2_10_ = Var74;
  auVar73[1] = uVar162;
  uVar213 = (undefined1)(uVar1 >> 0x10);
  auVar73[0] = uVar213;
  uVar158 = (undefined1)((ulong)uVar147 >> 8);
  auVar72._2_12_ = auVar73;
  auVar72[1] = uVar158;
  uVar212 = (undefined1)(uVar1 >> 8);
  auVar72[0] = uVar212;
  uVar135 = (undefined1)uVar147;
  bVar197 = (byte)uVar1;
  auVar203._0_2_ = CONCAT11(uVar135,bVar197);
  auVar203._2_14_ = auVar72;
  uVar1 = *(ulong *)(s + lVar134 * 2 + -4);
  uVar147 = *(undefined8 *)(s + lVar134 * 3 + -4);
  uVar242 = (undefined1)((ulong)uVar147 >> 0x38);
  uVar195 = (undefined1)(uVar1 >> 0x38);
  auVar317._8_6_ = 0;
  auVar317._0_8_ = uVar1;
  auVar317[0xe] = uVar195;
  auVar317[0xf] = uVar242;
  auVar312._14_2_ = auVar317._14_2_;
  auVar312._8_5_ = 0;
  auVar312._0_8_ = uVar1;
  uVar240 = (undefined1)((ulong)uVar147 >> 0x30);
  auVar312[0xd] = uVar240;
  uVar187 = (undefined1)(uVar1 >> 0x30);
  auVar304._13_3_ = auVar312._13_3_;
  auVar304._8_4_ = 0;
  auVar304._0_8_ = uVar1;
  auVar304[0xc] = uVar187;
  auVar269._12_4_ = auVar304._12_4_;
  auVar269._8_3_ = 0;
  auVar269._0_8_ = uVar1;
  uVar239 = (undefined1)((ulong)uVar147 >> 0x28);
  auVar269[0xb] = uVar239;
  uVar184 = (undefined1)(uVar1 >> 0x28);
  auVar259._11_5_ = auVar269._11_5_;
  auVar259._8_2_ = 0;
  auVar259._0_8_ = uVar1;
  auVar259[10] = uVar184;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258[8] = 0;
  auVar258._0_8_ = uVar1;
  uVar238 = (undefined1)((ulong)uVar147 >> 0x20);
  auVar258[9] = uVar238;
  uVar176 = (undefined1)(uVar1 >> 0x20);
  auVar148._9_7_ = auVar258._9_7_;
  auVar148[8] = uVar176;
  auVar148._0_8_ = uVar1;
  uVar237 = (undefined1)((ulong)uVar147 >> 0x18);
  uVar172 = (undefined1)(uVar1 >> 0x18);
  Var77 = CONCAT91(CONCAT81(auVar148._8_8_,uVar237),uVar172);
  uVar236 = (undefined1)((ulong)uVar147 >> 0x10);
  auVar76._2_10_ = Var77;
  auVar76[1] = uVar236;
  uVar163 = (undefined1)(uVar1 >> 0x10);
  auVar76[0] = uVar163;
  uVar235 = (undefined1)((ulong)uVar147 >> 8);
  auVar75._2_12_ = auVar76;
  auVar75[1] = uVar235;
  uVar159 = (undefined1)(uVar1 >> 8);
  auVar75[0] = uVar159;
  uVar136 = (undefined1)uVar1;
  uVar222 = (undefined1)uVar147;
  uVar244 = (ushort)Var74;
  auVar268._0_12_ = auVar203._0_12_;
  auVar268._12_2_ = uVar244;
  auVar268._14_2_ = (short)Var77;
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._0_10_ = auVar203._0_10_;
  auVar267._10_2_ = auVar76._0_2_;
  uVar243 = auVar73._0_2_;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._0_8_ = auVar203._0_8_;
  auVar266._8_2_ = uVar243;
  uVar281 = auVar266._8_8_;
  auVar78._4_8_ = uVar281;
  auVar78._2_2_ = auVar75._0_2_;
  uVar316 = auVar72._0_2_;
  auVar78._0_2_ = uVar316;
  auVar265._0_4_ = CONCAT22(CONCAT11(uVar222,uVar136),auVar203._0_2_);
  auVar265._4_12_ = auVar78;
  uVar198 = auVar204._8_2_;
  uVar199 = CONCAT22(auVar148._8_2_,uVar198);
  uVar221 = auVar206._10_2_;
  uVar147 = CONCAT26(auVar259._10_2_,CONCAT24(uVar221,uVar199));
  uVar322 = auVar208._12_2_;
  auVar200._0_10_ = CONCAT28(uVar322,uVar147);
  auVar200._10_2_ = auVar304._12_2_;
  auVar202._12_2_ = auVar209._14_2_;
  auVar202._0_12_ = auVar200;
  auVar211._14_2_ = auVar312._14_2_;
  auVar211._0_14_ = auVar202;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar281;
  uVar1 = auVar211._8_8_;
  auVar246._8_5_ = 0;
  auVar246._0_8_ = uVar1;
  uVar308 = auVar266._8_4_;
  auVar352._0_8_ = auVar78._0_8_;
  auVar352._8_4_ = uVar308;
  auVar352._12_4_ = auVar211._12_4_;
  uVar245 = auVar200._8_4_;
  auVar351._8_8_ = auVar352._8_8_;
  auVar351._0_4_ = auVar78._0_4_;
  auVar351._4_4_ = uVar245;
  auVar303._8_4_ = auVar267._12_4_;
  auVar303._0_8_ = uVar281;
  auVar303._12_4_ = uVar245;
  uVar145 = (undefined4)((ulong)uVar147 >> 0x20);
  auVar302._8_8_ = auVar303._8_8_;
  auVar302._4_4_ = uVar145;
  auVar302._0_4_ = uVar308;
  auVar311._4_8_ = 0;
  auVar311._0_4_ = auVar267._12_4_;
  auVar311._12_4_ = uVar145;
  auVar310._8_8_ = auVar311._8_8_;
  auVar310._0_8_ = CONCAT44(uVar199,auVar267._12_4_);
  auVar327._8_4_ = uVar199;
  auVar327._0_8_ = auVar310._0_8_;
  auVar327._12_4_ = uVar145;
  auVar326._8_8_ = auVar327._8_8_;
  auVar326._4_4_ = uVar308;
  auVar326._0_4_ = auVar267._12_4_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = auVar326._8_8_;
  auVar148 = psubusb(auVar302,auVar310);
  auVar317 = psubusb(auVar310,auVar302);
  auVar317 = auVar317 | auVar148;
  auVar148 = psubusb(auVar326,auVar249);
  auVar258 = psubusb(auVar249,auVar326);
  auVar258 = auVar258 | auVar148;
  bVar2 = auVar317[0];
  bVar138 = auVar317[4];
  bVar137 = (bVar138 < bVar2) * bVar2 | (bVar138 >= bVar2) * bVar138;
  bVar3 = auVar317[1];
  bVar161 = auVar317[5];
  bVar160 = (bVar161 < bVar3) * bVar3 | (bVar161 >= bVar3) * bVar161;
  bVar4 = auVar317[2];
  bVar165 = auVar317[6];
  bVar164 = (bVar165 < bVar4) * bVar4 | (bVar165 >= bVar4) * bVar165;
  bVar5 = auVar317[3];
  bVar174 = auVar317[7];
  bVar173 = (bVar174 < bVar5) * bVar5 | (bVar174 >= bVar5) * bVar174;
  bVar264 = auVar317[8];
  bVar177 = (bVar264 < bVar138) * bVar138 | (bVar264 >= bVar138) * bVar264;
  bVar271 = auVar317[9];
  bVar185 = (bVar271 < bVar161) * bVar161 | (bVar271 >= bVar161) * bVar271;
  bVar273 = auVar317[10];
  bVar188 = (bVar273 < bVar165) * bVar165 | (bVar273 >= bVar165) * bVar273;
  bVar275 = auVar317[0xb];
  bVar196 = (bVar275 < bVar174) * bVar174 | (bVar275 >= bVar174) * bVar275;
  bVar286 = *_thresh;
  bVar291 = _thresh[1];
  bVar314 = _thresh[2];
  bVar289 = _thresh[3];
  bVar315 = _thresh[4];
  bVar69 = _thresh[5];
  bVar70 = _thresh[6];
  bVar71 = _thresh[7];
  uVar292 = CONCAT13(-((byte)((bVar173 < bVar289) * bVar173 | (bVar173 >= bVar289) * bVar289) ==
                      bVar173),
                     CONCAT12(-((byte)((bVar164 < bVar314) * bVar164 |
                                      (bVar164 >= bVar314) * bVar314) == bVar164),
                              CONCAT11(-((byte)((bVar160 < bVar291) * bVar160 |
                                               (bVar160 >= bVar291) * bVar291) == bVar160),
                                       -((byte)((bVar137 < bVar286) * bVar137 |
                                               (bVar137 >= bVar286) * bVar286) == bVar137))));
  auVar148 = paddusb(auVar258,auVar258);
  auVar331._0_2_ = auVar258._4_2_ >> 1;
  auVar331._2_2_ = auVar258._6_2_ >> 1;
  auVar331._4_2_ = auVar258._8_2_ >> 1;
  auVar331._6_2_ = auVar258._10_2_ >> 1;
  auVar331._8_2_ = auVar258._12_2_ >> 1;
  auVar331._10_2_ = auVar258._14_2_ >> 1;
  auVar331._12_4_ = 0;
  auVar332 = paddusb(auVar331 & _DAT_004ce4d0,auVar148);
  auVar148 = psubusb(auVar351,auVar302);
  auVar304 = psubusb(auVar302,auVar351);
  auVar304 = auVar304 | auVar148;
  auVar149._4_4_ = auVar211._12_4_;
  auVar149._0_4_ = auVar265._0_4_;
  auVar149._8_4_ = auVar351._0_4_;
  auVar149._12_4_ = 0;
  auVar269 = psubusb(auVar351,auVar149);
  auVar258 = psubusb(auVar351,auVar310);
  auVar259 = psubusb(auVar149,auVar310);
  auVar312 = psubusb(auVar310,auVar149);
  auVar148 = psubusb(auVar149,auVar351);
  auVar269 = auVar269 | auVar148;
  bVar286 = auVar304[0];
  bVar291 = auVar269[0];
  bVar263 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[1];
  bVar291 = auVar269[1];
  bVar270 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[2];
  bVar291 = auVar269[2];
  bVar272 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[3];
  bVar291 = auVar269[3];
  bVar274 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[4];
  bVar291 = auVar269[4];
  bVar276 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[5];
  bVar291 = auVar269[5];
  bVar277 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[6];
  bVar291 = auVar269[6];
  bVar278 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[7];
  bVar291 = auVar269[7];
  bVar279 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[8];
  bVar291 = auVar269[8];
  bVar280 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[9];
  bVar291 = auVar269[9];
  bVar282 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[10];
  bVar291 = auVar269[10];
  bVar283 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[0xb];
  bVar291 = auVar269[0xb];
  bVar284 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[0xc];
  bVar291 = auVar269[0xc];
  bVar285 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[0xd];
  bVar291 = auVar269[0xd];
  bVar287 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[0xe];
  bVar291 = auVar269[0xe];
  bVar314 = auVar269[0xf];
  bVar288 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar304[0xf];
  bVar290 = (bVar314 < bVar286) * bVar286 | (bVar314 >= bVar286) * bVar314;
  auVar148 = psubusb(auVar332,*(undefined1 (*) [16])_blimit);
  uVar329 = auVar148._0_8_ & 0xffffffff;
  bVar286 = -((char)uVar329 == '\0') ^ 0xff;
  bVar291 = -((char)(uVar329 >> 8) == '\0') ^ 0xff;
  bVar314 = -((char)(uVar329 >> 0x10) == '\0') ^ 0xff;
  bVar289 = -((char)(uVar329 >> 0x18) == '\0') ^ 0xff;
  bVar137 = -(auVar148[4] == '\0') ^ 0xff;
  bVar164 = -(auVar148[5] == '\0') ^ 0xff;
  bVar349 = -(auVar148[6] == '\0') ^ 0xff;
  bVar350 = -(auVar148[7] == '\0') ^ 0xff;
  bVar328 = (bVar286 < bVar2) * bVar2 | (bVar286 >= bVar2) * bVar286;
  bVar344 = (bVar291 < bVar3) * bVar3 | (bVar291 >= bVar3) * bVar291;
  bVar345 = (bVar314 < bVar4) * bVar4 | (bVar314 >= bVar4) * bVar314;
  bVar346 = (bVar289 < bVar5) * bVar5 | (bVar289 >= bVar5) * bVar289;
  bVar291 = (bVar138 != 0) * bVar138;
  bVar286 = (bVar161 != 0) * bVar161;
  bVar173 = (bVar165 != 0) * bVar165;
  bVar160 = (bVar174 != 0) * bVar174;
  bVar347 = (bVar137 < bVar264) * bVar264 | (bVar137 >= bVar264) * bVar137;
  bVar348 = (bVar164 < bVar271) * bVar271 | (bVar164 >= bVar271) * bVar164;
  bVar349 = (bVar349 < bVar273) * bVar273 | (bVar349 >= bVar273) * bVar349;
  bVar350 = (bVar350 < bVar275) * bVar275 | (bVar350 >= bVar275) * bVar350;
  bVar164 = (auVar317[0xc] != '\0') * auVar317[0xc];
  bVar137 = (auVar317[0xd] != '\0') * auVar317[0xd];
  bVar289 = (auVar317[0xe] != '\0') * auVar317[0xe];
  bVar314 = (auVar317[0xf] != '\0') * auVar317[0xf];
  bVar264 = (bVar263 < bVar328) * bVar328 | (bVar263 >= bVar328) * bVar263;
  bVar271 = (bVar270 < bVar344) * bVar344 | (bVar270 >= bVar344) * bVar270;
  bVar273 = (bVar272 < bVar345) * bVar345 | (bVar272 >= bVar345) * bVar272;
  bVar275 = (bVar274 < bVar346) * bVar346 | (bVar274 >= bVar346) * bVar274;
  bVar263 = (bVar276 < bVar291) * bVar291 | (bVar276 >= bVar291) * bVar276;
  bVar270 = (bVar277 < bVar286) * bVar286 | (bVar277 >= bVar286) * bVar277;
  bVar173 = (bVar278 < bVar173) * bVar173 | (bVar278 >= bVar173) * bVar278;
  bVar160 = (bVar279 < bVar160) * bVar160 | (bVar279 >= bVar160) * bVar279;
  bVar272 = (bVar280 < bVar347) * bVar347 | (bVar280 >= bVar347) * bVar280;
  bVar274 = (bVar282 < bVar348) * bVar348 | (bVar282 >= bVar348) * bVar282;
  bVar276 = (bVar283 < bVar349) * bVar349 | (bVar283 >= bVar349) * bVar283;
  bVar277 = (bVar284 < bVar350) * bVar350 | (bVar284 >= bVar350) * bVar284;
  bVar286 = (bVar285 < bVar164) * bVar164 | (bVar285 >= bVar164) * bVar285;
  bVar137 = (bVar287 < bVar137) * bVar137 | (bVar287 >= bVar137) * bVar287;
  bVar289 = (bVar288 < bVar289) * bVar289 | (bVar288 >= bVar289) * bVar288;
  bVar291 = (bVar290 < bVar314) * bVar314 | (bVar290 >= bVar314) * bVar290;
  bVar280 = (bVar263 < bVar264) * bVar264 | (bVar263 >= bVar264) * bVar263;
  bVar282 = (bVar270 < bVar271) * bVar271 | (bVar270 >= bVar271) * bVar270;
  bVar283 = (bVar173 < bVar273) * bVar273 | (bVar173 >= bVar273) * bVar173;
  bVar284 = (bVar160 < bVar275) * bVar275 | (bVar160 >= bVar275) * bVar160;
  bVar285 = (bVar272 < bVar263) * bVar263 | (bVar272 >= bVar263) * bVar272;
  bVar287 = (bVar274 < bVar270) * bVar270 | (bVar274 >= bVar270) * bVar274;
  bVar288 = (bVar276 < bVar173) * bVar173 | (bVar276 >= bVar173) * bVar276;
  bVar290 = (bVar277 < bVar160) * bVar160 | (bVar277 >= bVar160) * bVar277;
  bVar328 = (bVar286 < bVar272) * bVar272 | (bVar286 >= bVar272) * bVar286;
  bVar344 = (bVar137 < bVar274) * bVar274 | (bVar137 >= bVar274) * bVar137;
  bVar345 = (bVar289 < bVar276) * bVar276 | (bVar289 >= bVar276) * bVar289;
  bVar346 = (bVar291 < bVar277) * bVar277 | (bVar291 >= bVar277) * bVar291;
  bVar286 = (bVar286 != 0) * bVar286;
  bVar137 = (bVar137 != 0) * bVar137;
  bVar289 = (bVar289 != 0) * bVar289;
  bVar291 = (bVar291 != 0) * bVar291;
  bVar314 = *_limit;
  bVar160 = _limit[1];
  bVar164 = _limit[2];
  bVar173 = _limit[3];
  bVar264 = _limit[4];
  bVar271 = _limit[5];
  bVar273 = _limit[6];
  bVar275 = _limit[7];
  bVar263 = _limit[8];
  bVar270 = _limit[9];
  bVar272 = _limit[10];
  bVar274 = _limit[0xb];
  bVar276 = _limit[0xc];
  bVar277 = _limit[0xd];
  bVar278 = _limit[0xe];
  bVar279 = _limit[0xf];
  auVar332._0_4_ =
       CONCAT13(-((byte)((bVar284 < bVar173) * bVar284 | (bVar284 >= bVar173) * bVar173) == bVar284)
                ,CONCAT12(-((byte)((bVar283 < bVar164) * bVar283 | (bVar283 >= bVar164) * bVar164)
                           == bVar283),
                          CONCAT11(-((byte)((bVar282 < bVar160) * bVar282 |
                                           (bVar282 >= bVar160) * bVar160) == bVar282),
                                   -((byte)((bVar280 < bVar314) * bVar280 |
                                           (bVar280 >= bVar314) * bVar314) == bVar280))));
  auVar332[4] = -((byte)((bVar285 < bVar264) * bVar285 | (bVar285 >= bVar264) * bVar264) == bVar285)
  ;
  auVar332[5] = -((byte)((bVar287 < bVar271) * bVar287 | (bVar287 >= bVar271) * bVar271) == bVar287)
  ;
  auVar332[6] = -((byte)((bVar288 < bVar273) * bVar288 | (bVar288 >= bVar273) * bVar273) == bVar288)
  ;
  auVar332[7] = -((byte)((bVar290 < bVar275) * bVar290 | (bVar290 >= bVar275) * bVar275) == bVar290)
  ;
  auVar332[8] = -((byte)((bVar328 < bVar263) * bVar328 | (bVar328 >= bVar263) * bVar263) == bVar328)
  ;
  auVar332[9] = -((byte)((bVar344 < bVar270) * bVar344 | (bVar344 >= bVar270) * bVar270) == bVar344)
  ;
  auVar332[10] = -((byte)((bVar345 < bVar272) * bVar345 | (bVar345 >= bVar272) * bVar272) == bVar345
                  );
  auVar332[0xb] =
       -((byte)((bVar346 < bVar274) * bVar346 | (bVar346 >= bVar274) * bVar274) == bVar346);
  auVar332[0xc] =
       -((byte)((bVar286 < bVar276) * bVar286 | (bVar286 >= bVar276) * bVar276) == bVar286);
  auVar332[0xd] =
       -((byte)((bVar137 < bVar277) * bVar137 | (bVar137 >= bVar277) * bVar277) == bVar137);
  auVar332[0xe] =
       -((byte)((bVar289 < bVar278) * bVar289 | (bVar289 >= bVar278) * bVar278) == bVar289);
  auVar332[0xf] =
       -((byte)((bVar291 < bVar279) * bVar291 | (bVar291 >= bVar279) * bVar279) == bVar291);
  auVar269 = psubsb(auVar326 ^ _DAT_004cf820,auVar249 ^ _DAT_004cf820);
  uVar145 = (undefined4)
            (CONCAT17(-((byte)((bVar196 < bVar71) * bVar196 | (bVar196 >= bVar71) * bVar71) ==
                       bVar196),
                      CONCAT16(-((byte)((bVar188 < bVar70) * bVar188 | (bVar188 >= bVar70) * bVar70)
                                == bVar188),
                               CONCAT15(-((byte)((bVar185 < bVar69) * bVar185 |
                                                (bVar185 >= bVar69) * bVar69) == bVar185),
                                        CONCAT14(-((byte)((bVar177 < bVar315) * bVar177 |
                                                         (bVar177 >= bVar315) * bVar315) == bVar177)
                                                 ,uVar292)))) >> 0x20);
  auVar305._4_4_ = uVar292;
  auVar305._0_4_ = uVar292;
  auVar305._8_4_ = uVar145;
  auVar305._12_4_ = uVar145;
  auVar148 = psubsb(~auVar305 & auVar269 >> 0x20,auVar269);
  auVar148 = psubsb(auVar148,auVar269);
  auVar148 = psubsb(auVar148,auVar269);
  uVar145 = SUB164(auVar148 & auVar332,0);
  uVar308 = SUB164(auVar148 & auVar332,4);
  auVar293._4_4_ = uVar145;
  auVar293._0_4_ = uVar145;
  auVar293._8_4_ = uVar308;
  auVar293._12_4_ = uVar308;
  auVar148 = paddsb(auVar293,_DAT_00513880);
  auVar340._0_14_ = auVar269._0_14_;
  auVar340[0xe] = auVar269[7];
  auVar340[0xf] = auVar148[7];
  auVar339._14_2_ = auVar340._14_2_;
  auVar339._0_13_ = auVar269._0_13_;
  auVar339[0xd] = auVar148[6];
  auVar338._13_3_ = auVar339._13_3_;
  auVar338._0_12_ = auVar269._0_12_;
  auVar338[0xc] = auVar269[6];
  auVar337._12_4_ = auVar338._12_4_;
  auVar337._0_11_ = auVar269._0_11_;
  auVar337[0xb] = auVar148[5];
  auVar336._11_5_ = auVar337._11_5_;
  auVar336._0_10_ = auVar269._0_10_;
  auVar336[10] = auVar269[5];
  auVar335._10_6_ = auVar336._10_6_;
  auVar335._0_9_ = auVar269._0_9_;
  auVar335[9] = auVar148[4];
  auVar334._9_7_ = auVar335._9_7_;
  auVar334._0_8_ = auVar269._0_8_;
  auVar334[8] = auVar269[4];
  auVar333._8_8_ = auVar334._8_8_;
  auVar333[7] = auVar148[3];
  auVar333[6] = auVar269[3];
  auVar333[5] = auVar148[2];
  auVar333[4] = auVar269[2];
  auVar333[3] = auVar148[1];
  auVar333[2] = auVar269[1];
  auVar333[0] = auVar269[0];
  auVar333[1] = auVar148[0];
  auVar148 = psraw(auVar333,0xb);
  auVar269 = packsswb(auVar148,auVar148);
  auVar294[0] = auVar269[0] + '\x01';
  cVar295 = auVar269[1] + '\x01';
  cVar296 = auVar269[2] + '\x01';
  cVar297 = auVar269[3] + '\x01';
  cVar298 = auVar269[4] + '\x01';
  cVar299 = auVar269[5] + '\x01';
  cVar300 = auVar269[6] + '\x01';
  cVar301 = auVar269[7] + '\x01';
  auVar294._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar301,cVar301),cVar300),
                                                     cVar300),cVar299),cVar299),cVar298),
                 CONCAT11(cVar298,cVar301)) >> 8);
  auVar294[7] = cVar297;
  auVar294[6] = cVar297;
  auVar294[5] = cVar296;
  auVar294[4] = cVar296;
  auVar294[3] = cVar295;
  auVar294[2] = cVar295;
  auVar294[1] = auVar294[0];
  auVar148 = psraw(auVar294,9);
  auVar148 = packsswb(auVar148,auVar148);
  uVar292 = auVar148._0_4_ & uVar292;
  auVar342._0_8_ = auVar269._0_8_;
  auVar342._8_4_ = auVar269._4_4_;
  auVar342._12_4_ = uVar292;
  auVar341._8_8_ = auVar342._8_8_;
  auVar341._0_4_ = auVar269._0_4_;
  auVar341._4_4_ = uVar292;
  auVar148 = psubsb(auVar249 ^ _DAT_004cf820,auVar341);
  auVar343._8_8_ = 0;
  auVar343._0_8_ = auVar341._8_8_;
  auVar269 = paddsb(auVar343,auVar326 ^ _DAT_004cf820);
  auVar248 = auVar148._0_13_ ^ DAT_004cf820._0_13_;
  auVar330 = auVar269._0_13_ ^ DAT_004cf820._0_13_;
  auVar148 = psubusb(auVar310,auVar351);
  auVar148 = auVar148 | auVar258;
  auVar312 = auVar312 | auVar259;
  bVar286 = auVar148[0];
  bVar291 = auVar312[0];
  bVar291 = (bVar291 < bVar286) * bVar286 | (bVar291 >= bVar286) * bVar291;
  bVar286 = auVar148[1];
  bVar314 = auVar312[1];
  bVar314 = (bVar314 < bVar286) * bVar286 | (bVar314 >= bVar286) * bVar314;
  bVar286 = auVar148[2];
  bVar289 = auVar312[2];
  bVar289 = (bVar289 < bVar286) * bVar286 | (bVar289 >= bVar286) * bVar289;
  bVar286 = auVar148[3];
  bVar137 = auVar312[3];
  bVar137 = (bVar137 < bVar286) * bVar286 | (bVar137 >= bVar286) * bVar137;
  bVar286 = auVar148[4];
  bVar160 = auVar312[4];
  bVar160 = (bVar160 < bVar286) * bVar286 | (bVar160 >= bVar286) * bVar160;
  bVar286 = auVar148[5];
  bVar164 = auVar312[5];
  bVar164 = (bVar164 < bVar286) * bVar286 | (bVar164 >= bVar286) * bVar164;
  bVar286 = auVar148[6];
  bVar173 = auVar312[6];
  bVar173 = (bVar173 < bVar286) * bVar286 | (bVar173 >= bVar286) * bVar173;
  bVar286 = auVar148[7];
  bVar315 = auVar312[7];
  bVar315 = (bVar315 < bVar286) * bVar286 | (bVar315 >= bVar286) * bVar315;
  bVar286 = (bVar291 < bVar2) * bVar2 | (bVar291 >= bVar2) * bVar291;
  bVar291 = (bVar314 < bVar3) * bVar3 | (bVar314 >= bVar3) * bVar314;
  bVar314 = (bVar289 < bVar4) * bVar4 | (bVar289 >= bVar4) * bVar289;
  bVar289 = (bVar137 < bVar5) * bVar5 | (bVar137 >= bVar5) * bVar137;
  bVar137 = (bVar160 < bVar138) * bVar138 | (bVar160 >= bVar138) * bVar160;
  bVar160 = (bVar164 < bVar161) * bVar161 | (bVar164 >= bVar161) * bVar164;
  bVar164 = (bVar173 < bVar165) * bVar165 | (bVar173 >= bVar165) * bVar173;
  bVar173 = (bVar315 < bVar174) * bVar174 | (bVar315 >= bVar174) * bVar315;
  bVar286 = (bVar137 < bVar286) * bVar286 | (bVar137 >= bVar286) * bVar137;
  bVar291 = (bVar160 < bVar291) * bVar291 | (bVar160 >= bVar291) * bVar160;
  bVar314 = (bVar164 < bVar314) * bVar314 | (bVar164 >= bVar314) * bVar164;
  bVar289 = (bVar173 < bVar289) * bVar289 | (bVar173 >= bVar289) * bVar173;
  uVar292 = CONCAT13(-((byte)((bVar289 == 0) * bVar289 | bVar289 != 0) == bVar289),
                     CONCAT12(-((byte)((bVar314 == 0) * bVar314 | bVar314 != 0) == bVar314),
                              CONCAT11(-((byte)((bVar291 == 0) * bVar291 | bVar291 != 0) == bVar291)
                                       ,-((byte)((bVar286 == 0) * bVar286 | bVar286 != 0) == bVar286
                                         )))) & auVar332._0_4_;
  auVar313._4_4_ = uVar292;
  auVar313._0_4_ = uVar292;
  auVar313._8_4_ = uVar292;
  auVar313._12_4_ = uVar292;
  cVar295 = (char)uVar292;
  auVar150[0] = -(cVar295 == '\0');
  cVar296 = (char)(uVar292 >> 8);
  auVar150[1] = -(cVar296 == '\0');
  cVar297 = (char)(uVar292 >> 0x10);
  auVar150[2] = -(cVar297 == '\0');
  cVar298 = (char)(uVar292 >> 0x18);
  auVar150[3] = -(cVar298 == '\0');
  auVar150[4] = -(cVar295 == '\0');
  auVar150[5] = -(cVar296 == '\0');
  auVar150[6] = -(cVar297 == '\0');
  auVar150[7] = -(cVar298 == '\0');
  auVar150[8] = -(cVar295 == '\0');
  auVar150[9] = -(cVar296 == '\0');
  auVar150[10] = -(cVar297 == '\0');
  auVar150[0xb] = -(cVar298 == '\0');
  auVar150[0xc] = -(cVar295 == '\0');
  auVar150[0xd] = -(cVar296 == '\0');
  auVar150[0xe] = -(cVar297 == '\0');
  auVar150[0xf] = -(cVar298 == '\0');
  if ((ushort)((ushort)(SUB161(auVar150 >> 7,0) & 1) | (ushort)(SUB161(auVar150 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar150 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar150 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar150 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar150 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar150 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar150 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar150 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar150 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar150 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar150 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar150 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar150 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar150 >> 0x77,0) & 1) << 0xe | (ushort)(auVar150[0xf] >> 7) << 0xf
              ) != 0xffff) {
    auVar7._12_2_ = 0;
    auVar7._0_12_ = auVar78;
    auVar7[0xe] = uVar236;
    auVar15[0xc] = uVar163;
    auVar15._0_12_ = auVar78;
    auVar15._13_2_ = auVar7._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar78._0_11_;
    auVar23._12_3_ = auVar15._12_3_;
    auVar31[10] = uVar162;
    auVar31._0_10_ = auVar78._0_10_;
    auVar31._11_4_ = auVar23._11_4_;
    auVar39[9] = 0;
    auVar39._0_9_ = auVar78._0_9_;
    auVar39._10_5_ = auVar31._10_5_;
    auVar47[8] = uVar213;
    auVar47._0_8_ = auVar352._0_8_;
    auVar47._9_6_ = auVar39._9_6_;
    auVar79._7_8_ = 0;
    auVar79._0_7_ = auVar47._8_7_;
    Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),uVar235);
    auVar109._9_6_ = 0;
    auVar109._0_9_ = Var80;
    auVar81._1_10_ = SUB1510(auVar109 << 0x30,5);
    auVar81[0] = uVar159;
    auVar110._11_4_ = 0;
    auVar110._0_11_ = auVar81;
    auVar58[2] = uVar158;
    auVar58._0_2_ = uVar316;
    auVar58._3_12_ = SUB1512(auVar110 << 0x20,3);
    uVar316 = uVar316 & 0xff;
    auVar8._12_2_ = 0;
    auVar8._0_12_ = auVar6;
    auVar8[0xe] = uVar237;
    auVar16[0xc] = uVar172;
    auVar16._0_12_ = auVar6;
    auVar16._13_2_ = auVar8._13_2_;
    auVar24._8_4_ = 0;
    auVar24._0_8_ = uVar281;
    auVar24._12_3_ = auVar16._12_3_;
    auVar32._8_2_ = 0;
    auVar32._0_8_ = uVar281;
    auVar32[10] = uVar171;
    auVar32._11_4_ = auVar24._11_4_;
    auVar40._8_2_ = 0;
    auVar40._0_8_ = uVar281;
    auVar40._10_5_ = auVar32._10_5_;
    auVar48[8] = uVar215;
    auVar48._0_8_ = uVar281;
    auVar48._9_6_ = auVar40._9_6_;
    auVar82._7_8_ = 0;
    auVar82._0_7_ = auVar48._8_7_;
    Var83 = CONCAT81(SUB158(auVar82 << 0x40,7),uVar236);
    auVar111._9_6_ = 0;
    auVar111._0_9_ = Var83;
    auVar84._1_10_ = SUB1510(auVar111 << 0x30,5);
    auVar84[0] = uVar163;
    auVar112._11_4_ = 0;
    auVar112._0_11_ = auVar84;
    auVar59[2] = uVar162;
    auVar59._0_2_ = uVar243;
    auVar59._3_12_ = SUB1512(auVar112 << 0x20,3);
    uVar243 = uVar243 & 0xff;
    Var85 = CONCAT81(SUB158(ZEXT815(0),7),uVar237);
    auVar113._9_6_ = 0;
    auVar113._0_9_ = Var85;
    auVar86._1_10_ = SUB1510(auVar113 << 0x30,5);
    auVar86[0] = uVar172;
    auVar114._11_4_ = 0;
    auVar114._0_11_ = auVar86;
    auVar60[2] = uVar171;
    auVar60._0_2_ = uVar244;
    auVar60._3_12_ = SUB1512(auVar114 << 0x20,3);
    auVar9[0xd] = 0;
    auVar9._0_13_ = auVar202._0_13_;
    auVar9[0xe] = uVar239;
    auVar17[0xc] = uVar184;
    auVar17._0_12_ = auVar200;
    auVar17._13_2_ = auVar9._13_2_;
    auVar25[0xb] = 0;
    auVar25._0_11_ = auVar200._0_11_;
    auVar25._12_3_ = auVar17._12_3_;
    auVar33[10] = uVar183;
    auVar33._0_10_ = auVar200._0_10_;
    auVar33._11_4_ = auVar25._11_4_;
    auVar41[9] = 0;
    auVar41._0_9_ = (unkuint9)auVar200._0_10_;
    auVar41._10_5_ = auVar33._10_5_;
    auVar49[8] = uVar217;
    auVar49._0_8_ = uVar147;
    auVar49._9_6_ = auVar41._9_6_;
    auVar87._7_8_ = 0;
    auVar87._0_7_ = auVar49._8_7_;
    auVar55[6] = uVar238;
    auVar55._0_6_ = CONCAT24(uVar221,uVar199);
    auVar55._7_8_ = SUB158(auVar87 << 0x40,7);
    auVar88._9_6_ = 0;
    auVar88._0_9_ = auVar55._6_9_;
    auVar56[4] = uVar176;
    auVar56._0_4_ = uVar199;
    auVar56._5_10_ = SUB1510(auVar88 << 0x30,5);
    auVar89._11_4_ = 0;
    auVar89._0_11_ = auVar56._4_11_;
    auVar61[2] = uVar175;
    auVar61._0_2_ = uVar198;
    auVar61._3_12_ = SUB1512(auVar89 << 0x20,3);
    uVar198 = uVar198 & 0xff;
    auVar10[0xd] = 0;
    auVar10._0_13_ = auVar211._3_13_ >> 8;
    auVar10[0xe] = uVar240;
    auVar18[0xc] = uVar187;
    auVar18._0_12_ = auVar211._4_12_;
    auVar18._13_2_ = auVar10._13_2_;
    auVar26[0xb] = 0;
    auVar26._0_11_ = auVar211._4_11_;
    auVar26._12_3_ = auVar18._12_3_;
    auVar34[10] = uVar186;
    auVar34._0_10_ = auVar202._4_10_;
    auVar34._11_4_ = auVar26._11_4_;
    auVar42[9] = 0;
    auVar42._0_9_ = auVar202._4_9_;
    auVar42._10_5_ = auVar34._10_5_;
    auVar50[8] = uVar218;
    auVar50._0_8_ = auVar200._4_8_;
    auVar50._9_6_ = auVar42._9_6_;
    auVar90._7_8_ = 0;
    auVar90._0_7_ = auVar50._8_7_;
    Var91 = CONCAT81(SUB158(auVar90 << 0x40,7),uVar239);
    auVar115._9_6_ = 0;
    auVar115._0_9_ = Var91;
    auVar92._1_10_ = SUB1510(auVar115 << 0x30,5);
    auVar92[0] = uVar184;
    auVar116._11_4_ = 0;
    auVar116._0_11_ = auVar92;
    auVar62[2] = uVar183;
    auVar62._0_2_ = uVar221;
    auVar62._3_12_ = SUB1512(auVar116 << 0x20,3);
    auVar11._8_6_ = 0;
    auVar11._0_8_ = uVar1;
    auVar11[0xe] = uVar242;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar1;
    auVar19[0xc] = uVar195;
    auVar19._13_2_ = auVar11._13_2_;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = uVar1;
    auVar27._12_3_ = auVar19._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = uVar1;
    auVar35[10] = uVar194;
    auVar35._11_4_ = auVar27._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = uVar1;
    auVar43._10_5_ = auVar35._10_5_;
    auVar51[8] = uVar220;
    auVar51._0_8_ = uVar1;
    auVar51._9_6_ = auVar43._9_6_;
    auVar93._7_8_ = 0;
    auVar93._0_7_ = auVar51._8_7_;
    Var94 = CONCAT81(SUB158(auVar93 << 0x40,7),uVar240);
    auVar117._9_6_ = 0;
    auVar117._0_9_ = Var94;
    auVar57[4] = uVar187;
    auVar57._0_4_ = uVar245;
    auVar57._5_10_ = SUB1510(auVar117 << 0x30,5);
    auVar95._11_4_ = 0;
    auVar95._0_11_ = auVar57._4_11_;
    auVar63[2] = uVar186;
    auVar63._0_2_ = uVar322;
    auVar63._3_12_ = SUB1512(auVar95 << 0x20,3);
    auVar12[0xd] = 0;
    auVar12._0_13_ = auVar265._0_13_;
    auVar12[0xe] = uVar235;
    auVar20[0xc] = uVar159;
    auVar20._0_12_ = auVar265._0_12_;
    auVar20._13_2_ = auVar12._13_2_;
    auVar28[0xb] = 0;
    auVar28._0_11_ = auVar265._0_11_;
    auVar28._12_3_ = auVar20._12_3_;
    auVar36[10] = uVar158;
    auVar36._0_10_ = auVar265._0_10_;
    auVar36._11_4_ = auVar28._11_4_;
    auVar44[9] = 0;
    auVar44._0_9_ = auVar265._0_9_;
    auVar44._10_5_ = auVar36._10_5_;
    auVar52[8] = uVar212;
    auVar52._0_8_ = auVar265._0_8_;
    auVar52._9_6_ = auVar44._9_6_;
    auVar96._7_8_ = 0;
    auVar96._0_7_ = auVar52._8_7_;
    Var97 = CONCAT81(SUB158(auVar96 << 0x40,7),uVar222);
    auVar118._9_6_ = 0;
    auVar118._0_9_ = Var97;
    auVar98._1_10_ = SUB1510(auVar118 << 0x30,5);
    auVar98[0] = uVar136;
    auVar119._11_4_ = 0;
    auVar119._0_11_ = auVar98;
    auVar64[2] = uVar135;
    auVar64._0_2_ = auVar203._0_2_;
    auVar64._3_12_ = SUB1512(auVar119 << 0x20,3);
    uVar319 = (ushort)bVar197;
    sVar166 = auVar64._2_2_;
    sVar178 = auVar98._0_2_;
    sVar189 = (short)Var97;
    sVar251 = auVar59._2_2_;
    sVar306 = auVar58._2_2_;
    sVar253 = auVar84._0_2_;
    sVar307 = auVar81._0_2_;
    sVar255 = (short)Var83;
    sVar309 = (short)Var80;
    sVar241 = (short)Var85;
    sVar139 = uVar319 * 2 + (uVar244 & 0xff) + uVar243 + uVar316 + 4;
    sVar167 = sVar166 * 2 + auVar60._2_2_ + sVar251 + sVar306 + 4;
    sVar179 = sVar178 * 2 + auVar86._0_2_ + sVar253 + sVar307 + 4;
    sVar190 = sVar189 * 2 + sVar241 + sVar255 + sVar309 + 4;
    sVar214 = auVar61._2_2_;
    sVar216 = auVar56._4_2_;
    sVar219 = auVar55._6_2_;
    sVar250 = (uVar221 & 0xff) + uVar198;
    sVar252 = auVar62._2_2_ + sVar214;
    sVar254 = auVar92._0_2_ + sVar216;
    sVar257 = (short)Var91;
    sVar256 = sVar257 + sVar219;
    sVar140 = (sVar139 - uVar319) + (uVar322 & 0xff);
    sVar168 = (sVar167 - sVar166) + auVar63._2_2_;
    sVar180 = (sVar179 - sVar178) + auVar57._4_2_;
    sVar247 = (short)Var94;
    sVar191 = (sVar190 - sVar189) + sVar247;
    Var101 = CONCAT91(SUB169(ZEXT816(0) << 0x40,7),uVar242);
    auVar125._10_6_ = 0;
    auVar125._0_10_ = Var101;
    auVar100._1_11_ = SUB1611(auVar125 << 0x30,5);
    auVar100[0] = uVar195;
    auVar124._12_4_ = 0;
    auVar124._0_12_ = auVar100;
    auVar99._1_13_ = SUB1613(auVar124 << 0x20,3);
    auVar99[0] = uVar194;
    uVar323 = auVar209._14_2_ & 0xff;
    sVar141 = (sVar140 - uVar319) + uVar323;
    sVar260 = auVar99._0_2_;
    sVar169 = (sVar168 - sVar166) + sVar260;
    sVar261 = auVar100._0_2_;
    sVar181 = (sVar180 - sVar178) + sVar261;
    sVar262 = (short)Var101;
    sVar192 = (sVar191 - sVar189) + sVar262;
    sVar142 = (sVar141 - uVar316) + uVar323;
    sVar170 = (sVar169 - sVar306) + sVar260;
    sVar182 = (sVar181 - sVar307) + sVar261;
    sVar193 = (sVar192 - sVar309) + sVar262;
    uVar316 = (ushort)(uVar319 + uVar198 + uVar316 + sVar139) >> 3;
    uVar319 = (ushort)(sVar166 + sVar214 + sVar306 + sVar167) >> 3;
    uVar320 = (ushort)(sVar178 + sVar216 + sVar307 + sVar179) >> 3;
    uVar321 = (ushort)(sVar189 + sVar219 + sVar309 + sVar190) >> 3;
    uVar322 = (ushort)(((uVar322 & 0xff) - uVar243) + uVar323 + sVar250 + sVar142) >> 3;
    uVar323 = (ushort)((auVar63._2_2_ - sVar251) + sVar260 + sVar252 + sVar170) >> 3;
    uVar324 = (ushort)((auVar57._4_2_ - sVar253) + sVar261 + sVar254 + sVar182) >> 3;
    uVar325 = (ushort)((sVar247 - sVar255) + sVar262 + sVar256 + sVar193) >> 3;
    auVar318[1] = (uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319);
    auVar318[0] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar318[2] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
    auVar318[3] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
    auVar318[4] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
    auVar318[5] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar318[6] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
    auVar318[7] = (uVar325 != 0) * (uVar325 < 0x100) * (char)uVar325 - (0xff < uVar325);
    auVar318[8] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar318[9] = (uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319);
    auVar318[10] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
    auVar318[0xb] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
    auVar318[0xc] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
    auVar318[0xd] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar318[0xe] = (uVar324 != 0) * (uVar324 < 0x100) * (char)uVar324 - (0xff < uVar324);
    auVar318[0xf] = (uVar325 != 0) * (uVar325 < 0x100) * (char)uVar325 - (0xff < uVar325);
    auVar148 = auVar318 & auVar313 | ~auVar313 & auVar351;
    auVar352._0_8_ = auVar148._0_8_;
    auVar246 = auVar313._0_13_;
    uVar198 = (ushort)(uVar198 + sVar250 + sVar141) >> 3;
    uVar322 = (ushort)(sVar214 + sVar252 + sVar169) >> 3;
    uVar316 = (ushort)(sVar216 + sVar254 + sVar181) >> 3;
    uVar319 = (ushort)(sVar219 + sVar256 + sVar192) >> 3;
    uVar221 = (ushort)((uVar221 & 0xff) + sVar250 + sVar142) >> 3;
    uVar323 = (ushort)(auVar62._2_2_ + sVar252 + sVar170) >> 3;
    uVar320 = (ushort)(auVar92._0_2_ + sVar254 + sVar182) >> 3;
    uVar321 = (ushort)(sVar257 + sVar256 + sVar193) >> 3;
    auVar201[1] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
    auVar201[0] = (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar198 - (0xff < uVar198);
    auVar201[2] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar201[3] = (uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319);
    auVar201[4] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
    auVar201[5] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar201[6] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
    auVar201[7] = (uVar321 != 0) * (uVar321 < 0x100) * (char)uVar321 - (0xff < uVar321);
    auVar201[8] = (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar198 - (0xff < uVar198);
    auVar201[9] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
    auVar201[10] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar201[0xb] = (uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319);
    auVar201[0xc] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
    auVar248 = auVar201 & auVar246 | ~auVar246 & auVar248;
    uVar198 = (ushort)((uVar244 & 0xff) + sVar250 + sVar140) >> 3;
    uVar221 = (ushort)(auVar60._2_2_ + sVar252 + sVar168) >> 3;
    uVar322 = (ushort)(auVar86._0_2_ + sVar254 + sVar180) >> 3;
    uVar316 = (ushort)(sVar241 + sVar256 + sVar191) >> 3;
    uVar243 = (ushort)(sVar250 + uVar243 + sVar139) >> 3;
    uVar244 = (ushort)(sVar252 + sVar251 + sVar167) >> 3;
    uVar319 = (ushort)(sVar254 + sVar253 + sVar179) >> 3;
    uVar323 = (ushort)(sVar256 + sVar255 + sVar190) >> 3;
    auVar223[1] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
    auVar223[0] = (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar198 - (0xff < uVar198);
    auVar223[2] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
    auVar223[3] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar223[4] = (uVar243 != 0) * (uVar243 < 0x100) * (char)uVar243 - (0xff < uVar243);
    auVar223[5] = (uVar244 != 0) * (uVar244 < 0x100) * (char)uVar244 - (0xff < uVar244);
    auVar223[6] = (uVar319 != 0) * (uVar319 < 0x100) * (char)uVar319 - (0xff < uVar319);
    auVar223[7] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
    auVar223[8] = (uVar198 != 0) * (uVar198 < 0x100) * (char)uVar198 - (0xff < uVar198);
    auVar223[9] = (uVar221 != 0) * (uVar221 < 0x100) * (char)uVar221 - (0xff < uVar221);
    auVar223[10] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
    auVar223[0xb] = (uVar316 != 0) * (uVar316 < 0x100) * (char)uVar316 - (0xff < uVar316);
    auVar223[0xc] = (uVar243 != 0) * (uVar243 < 0x100) * (char)uVar243 - (0xff < uVar243);
    auVar330 = auVar223 & auVar246 | ~auVar246 & auVar330;
    auVar246 = auVar148._3_13_ >> 8;
  }
  auVar231._0_14_ = auVar265._0_14_;
  auVar231[0xe] = uVar235;
  auVar231[0xf] = (char)((ulong)auVar352._0_8_ >> 0x38);
  auVar230._14_2_ = auVar231._14_2_;
  auVar230[0xd] = (char)((ulong)auVar352._0_8_ >> 0x30);
  auVar230._0_13_ = auVar265._0_13_;
  auVar229._13_3_ = auVar230._13_3_;
  auVar229[0xc] = uVar159;
  auVar229._0_12_ = auVar265._0_12_;
  auVar228._12_4_ = auVar229._12_4_;
  auVar228[0xb] = (char)((ulong)auVar352._0_8_ >> 0x28);
  auVar228._0_11_ = auVar265._0_11_;
  auVar227._11_5_ = auVar228._11_5_;
  auVar227[10] = uVar158;
  auVar227._0_10_ = auVar265._0_10_;
  auVar226._10_6_ = auVar227._10_6_;
  auVar226[9] = (char)((ulong)auVar352._0_8_ >> 0x20);
  auVar226._0_9_ = auVar265._0_9_;
  auVar225._9_7_ = auVar226._9_7_;
  auVar225[8] = uVar212;
  auVar225._0_8_ = auVar265._0_8_;
  Var74 = CONCAT91(CONCAT81(auVar225._8_8_,(char)((ulong)auVar352._0_8_ >> 0x18)),uVar222);
  auVar103._2_10_ = Var74;
  auVar103[1] = (char)((ulong)auVar352._0_8_ >> 0x10);
  auVar103[0] = uVar136;
  auVar102._2_12_ = auVar103;
  auVar102[1] = (char)((ulong)auVar352._0_8_ >> 8);
  auVar102[0] = uVar135;
  uVar353 = CONCAT11((char)auVar352._0_8_,bVar197);
  auVar224._2_14_ = auVar102;
  auVar13[0xd] = 0;
  auVar13._0_13_ = auVar330;
  auVar13[0xe] = auVar330[7];
  auVar21[0xc] = auVar330[6];
  auVar21._0_12_ = auVar330._0_12_;
  auVar21._13_2_ = auVar13._13_2_;
  auVar29[0xb] = 0;
  auVar29._0_11_ = auVar330._0_11_;
  auVar29._12_3_ = auVar21._12_3_;
  auVar37[10] = auVar330[5];
  auVar37._0_10_ = auVar330._0_10_;
  auVar37._11_4_ = auVar29._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar330._0_9_;
  auVar45._10_5_ = auVar37._10_5_;
  auVar53[8] = auVar330[4];
  auVar53._0_8_ = auVar330._0_8_;
  auVar53._9_6_ = auVar45._9_6_;
  auVar104._7_8_ = 0;
  auVar104._0_7_ = auVar53._8_7_;
  auVar120._1_8_ = SUB158(auVar104 << 0x40,7);
  auVar120[0] = auVar330[3];
  auVar120._9_6_ = 0;
  auVar105._1_10_ = SUB1510(auVar120 << 0x30,5);
  auVar105[0] = auVar330[2];
  auVar121._11_4_ = 0;
  auVar121._0_11_ = auVar105;
  auVar65[2] = auVar330[1];
  auVar65._0_2_ = auVar330._0_2_;
  auVar65._3_12_ = SUB1512(auVar121 << 0x20,3);
  auVar67._2_13_ = auVar65._2_13_;
  auVar67._0_2_ = auVar330._0_2_ & 0xff;
  auVar151._4_4_ = auVar53._8_4_;
  auVar151._0_4_ = auVar67._0_4_;
  auVar151._8_4_ = auVar105._0_4_;
  auVar151._12_3_ = auVar21._12_3_;
  auVar151[0xf] = 0;
  auVar148 = pshuflw(auVar151,auVar151,0x72);
  auVar148 = pshufhw(auVar148,auVar148,0x72);
  sVar139 = auVar148._0_2_;
  sVar140 = auVar148._2_2_;
  uVar143 = CONCAT11((0 < sVar140) * (sVar140 < 0x100) * auVar148[2] - (0xff < sVar140),
                     (0 < sVar139) * (sVar139 < 0x100) * auVar148[0] - (0xff < sVar139));
  sVar139 = auVar148._4_2_;
  sVar140 = auVar148._6_2_;
  uVar145 = CONCAT13((0 < sVar140) * (sVar140 < 0x100) * auVar148[6] - (0xff < sVar140),
                     CONCAT12((0 < sVar139) * (sVar139 < 0x100) * auVar148[4] - (0xff < sVar139),
                              uVar143));
  sVar139 = auVar148._8_2_;
  sVar140 = auVar148._10_2_;
  uVar146 = CONCAT15((0 < sVar140) * (sVar140 < 0x100) * auVar148[10] - (0xff < sVar140),
                     CONCAT14((0 < sVar139) * (sVar139 < 0x100) * auVar148[8] - (0xff < sVar139),
                              uVar145));
  sVar139 = auVar148._12_2_;
  sVar140 = auVar148._14_2_;
  auVar234._0_12_ = auVar224._0_12_;
  auVar234._12_2_ = (short)Var74;
  auVar234._14_2_ =
       (short)(CONCAT17((0 < sVar140) * (sVar140 < 0x100) * auVar148[0xe] - (0xff < sVar140),
                        CONCAT16((0 < sVar139) * (sVar139 < 0x100) * auVar148[0xc] -
                                 (0xff < sVar139),uVar146)) >> 0x30);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._0_10_ = auVar224._0_10_;
  auVar233._10_2_ = (short)((uint6)uVar146 >> 0x20);
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._0_8_ = auVar224._0_8_;
  auVar232._8_2_ = auVar103._0_2_;
  auVar106._4_8_ = auVar232._8_8_;
  auVar106._2_2_ = (short)((uint)uVar145 >> 0x10);
  auVar106._0_2_ = auVar102._0_2_;
  auVar14[0xd] = 0;
  auVar14._0_13_ = auVar248;
  auVar14[0xe] = auVar248[7];
  auVar22[0xc] = auVar248[6];
  auVar22._0_12_ = auVar248._0_12_;
  auVar22._13_2_ = auVar14._13_2_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar248._0_11_;
  auVar30._12_3_ = auVar22._12_3_;
  auVar38[10] = auVar248[5];
  auVar38._0_10_ = auVar248._0_10_;
  auVar38._11_4_ = auVar30._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar248._0_9_;
  auVar46._10_5_ = auVar38._10_5_;
  auVar54[8] = auVar248[4];
  auVar54._0_8_ = auVar248._0_8_;
  auVar54._9_6_ = auVar46._9_6_;
  auVar107._7_8_ = 0;
  auVar107._0_7_ = auVar54._8_7_;
  auVar122._1_8_ = SUB158(auVar107 << 0x40,7);
  auVar122[0] = auVar248[3];
  auVar122._9_6_ = 0;
  auVar108._1_10_ = SUB1510(auVar122 << 0x30,5);
  auVar108[0] = auVar248[2];
  auVar123._11_4_ = 0;
  auVar123._0_11_ = auVar108;
  auVar66[2] = auVar248[1];
  auVar66._0_2_ = auVar248._0_2_;
  auVar66._3_12_ = SUB1512(auVar123 << 0x20,3);
  auVar68._2_13_ = auVar66._2_13_;
  auVar68._0_2_ = auVar248._0_2_ & 0xff;
  auVar152._4_4_ = auVar54._8_4_;
  auVar152._0_4_ = auVar68._0_4_;
  auVar152._8_4_ = auVar108._0_4_;
  auVar152._12_3_ = auVar22._12_3_;
  auVar152[0xf] = 0;
  auVar148 = pshuflw(auVar152,auVar152,0xd8);
  auVar148 = pshufhw(auVar148,auVar148,0xd8);
  sVar139 = auVar148._0_2_;
  sVar140 = auVar148._2_2_;
  uVar144 = CONCAT11((0 < sVar140) * (sVar140 < 0x100) * auVar148[2] - (0xff < sVar140),
                     (0 < sVar139) * (sVar139 < 0x100) * auVar148[0] - (0xff < sVar139));
  sVar141 = auVar148._4_2_;
  sVar142 = auVar148._6_2_;
  auVar153._0_4_ =
       CONCAT13((0 < sVar142) * (sVar142 < 0x100) * auVar148[6] - (0xff < sVar142),
                CONCAT12((0 < sVar141) * (sVar141 < 0x100) * auVar148[4] - (0xff < sVar141),uVar144)
               );
  sVar166 = auVar148._8_2_;
  sVar167 = auVar148._10_2_;
  auVar154._0_6_ =
       CONCAT15((0 < sVar167) * (sVar167 < 0x100) * auVar148[10] - (0xff < sVar167),
                CONCAT14((0 < sVar166) * (sVar166 < 0x100) * auVar148[8] - (0xff < sVar166),
                         auVar153._0_4_));
  sVar166 = auVar148._12_2_;
  sVar167 = auVar148._14_2_;
  auVar155._0_8_ =
       CONCAT17((0 < sVar167) * (sVar167 < 0x100) * auVar148[0xe] - (0xff < sVar167),
                CONCAT16((0 < sVar166) * (sVar166 < 0x100) * auVar148[0xc] - (0xff < sVar166),
                         auVar154._0_6_));
  auVar156._0_10_ =
       CONCAT19((0 < sVar140) * (sVar140 < 0x100) * auVar148[2] - (0xff < sVar140),
                CONCAT18((0 < sVar139) * (sVar139 < 0x100) * auVar148[0] - (0xff < sVar139),
                         auVar155._0_8_));
  auVar157[10] = (0 < sVar141) * (sVar141 < 0x100) * auVar148[4] - (0xff < sVar141);
  auVar157._0_10_ = auVar156._0_10_;
  auVar157[0xb] = (0 < sVar142) * (sVar142 < 0x100) * auVar148[6] - (0xff < sVar142);
  auVar126[0xd] = 0;
  auVar126._0_13_ = auVar246;
  auVar126[0xe] = auVar246[7];
  auVar127[0xc] = auVar246[6];
  auVar127._0_12_ = auVar246._0_12_;
  auVar127._13_2_ = auVar126._13_2_;
  auVar128[0xb] = 0;
  auVar128._0_11_ = auVar246._0_11_;
  auVar128._12_3_ = auVar127._12_3_;
  auVar129[10] = auVar246[5];
  auVar129._0_10_ = auVar246._0_10_;
  auVar129._11_4_ = auVar128._11_4_;
  auVar130[9] = 0;
  auVar130._0_9_ = auVar246._0_9_;
  auVar130._10_5_ = auVar129._10_5_;
  auVar131[8] = auVar246[4];
  auVar131._0_8_ = auVar246._0_8_;
  auVar131._9_6_ = auVar130._9_6_;
  Var132 = CONCAT81(CONCAT71(auVar131._8_7_,uVar242),auVar246[3]);
  auVar133._2_9_ = Var132;
  auVar133[1] = uVar195;
  auVar133[0] = auVar246[2];
  auVar248._2_11_ = auVar133;
  auVar248[1] = uVar194;
  auVar248[0] = auVar246[1];
  auVar157._12_2_ = (short)((ulong)auVar155._0_8_ >> 0x30);
  auVar157._14_2_ = (short)Var132;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._10_2_ = auVar133._0_2_;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._8_2_ = (short)((uint6)auVar154._0_6_ >> 0x20);
  auVar154._8_8_ = auVar155._8_8_;
  auVar154._6_2_ = auVar248._0_2_;
  auVar153._6_10_ = auVar154._6_10_;
  auVar153._4_2_ = (short)((uint)auVar153._0_4_ >> 0x10);
  *(ulong *)(s + -4) =
       CONCAT44(CONCAT22(CONCAT11(uVar220,auVar246[0]),uVar144),CONCAT22(uVar143,uVar353));
  *(ulong *)(s + lVar134 + -4) = CONCAT44(auVar153._4_4_,auVar106._0_4_);
  *(ulong *)(s + lVar134 * 2 + -4) = CONCAT44(auVar155._8_4_,auVar232._8_4_);
  uVar147 = CONCAT44(auVar156._12_4_,auVar233._12_4_);
  *(undefined8 *)(s + lVar134 * 3 + -4) = uVar147;
  return;
}

Assistant:

void aom_lpf_vertical_8_sse2(unsigned char *s, int p,
                             const unsigned char *_blimit,
                             const unsigned char *_limit,
                             const unsigned char *_thresh) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;

  __m128i p0, q0;
  __m128i x2, x1, x0, x3;
  __m128i q1q0, p1p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  x3 = _mm_loadl_epi64((__m128i *)((s - 4) + 0 * p));
  x2 = _mm_loadl_epi64((__m128i *)((s - 4) + 1 * p));
  x1 = _mm_loadl_epi64((__m128i *)((s - 4) + 2 * p));
  x0 = _mm_loadl_epi64((__m128i *)((s - 4) + 3 * p));

  transpose4x8_8x4_sse2(&x3, &x2, &x1, &x0, &d0, &d1, &d2, &d3, &d4, &d5, &d6,
                        &d7);
  // Loop filtering
  lpf_internal_8_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4, &q1q0, &p1p0,
                      &blimit, &limit, &thresh);

  p0 = _mm_srli_si128(p1p0, 4);
  q0 = _mm_srli_si128(q1q0, 4);

  transpose8x8_low_sse2(&d0, &d1, &p0, &p1p0, &q1q0, &q0, &d6, &d7, &d0, &d1,
                        &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 4 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 4 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 4 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 4 + 3 * p), d3);
}